

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O1

void rpn_ISCONST(Expression *expr,Expression *src)

{
  expr->reason = (char *)0x0;
  expr->isKnown = true;
  expr->isSymbol = false;
  expr->rpn = (uint8_t *)0x0;
  expr->rpnCapacity = 0;
  expr->rpnLength = 0;
  expr->rpnPatchSize = 0;
  expr->val = (uint)src->isKnown;
  expr->isKnown = true;
  expr->isSymbol = false;
  return;
}

Assistant:

static void rpn_Init(struct Expression *expr)
{
	expr->reason = NULL;
	expr->isKnown = true;
	expr->isSymbol = false;
	expr->rpn = NULL;
	expr->rpnCapacity = 0;
	expr->rpnLength = 0;
	expr->rpnPatchSize = 0;
}